

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O2

size_t __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::size
          (mpmc_blocking_queue<spdlog::details::async_msg> *this)

{
  size_type *psVar1;
  ulong uVar2;
  size_type sVar3;
  size_t sVar4;
  
  CLI::std::mutex::lock((mutex *)this);
  uVar2 = (this->q_).tail_;
  psVar1 = &(this->q_).head_;
  sVar3 = *psVar1;
  if (uVar2 < *psVar1) {
    sVar4 = (this->q_).max_items_;
  }
  else {
    sVar4 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (uVar2 - sVar3) + sVar4;
}

Assistant:

size_t size() {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        return q_.size();
    }